

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hook.c
# Opt level: O2

void duckdb_je_hook_remove(tsdn_t *tsdn,void *opaque)

{
  hooks_internal_t local_40;
  
  malloc_mutex_lock(tsdn,(malloc_mutex_t *)opaque);
  seq_try_load_hooks(&local_40,(seq_hooks_t *)opaque);
  local_40.in_use = false;
  seq_store_hooks((seq_hooks_t *)opaque,&local_40);
  nhooks.repr = nhooks.repr - 1;
  duckdb_je_tsd_global_slow_dec(tsdn);
  hooks_mu.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&hooks_mu.field_0 + 0x48));
  return;
}

Assistant:

void
hook_remove(tsdn_t *tsdn, void *opaque) {
	if (config_debug) {
		char *hooks_begin = (char *)&hooks[0];
		char *hooks_end = (char *)&hooks[HOOK_MAX];
		char *hook = (char *)opaque;
		assert(hooks_begin <= hook && hook < hooks_end
		    && (hook - hooks_begin) % sizeof(seq_hooks_t) == 0);
	}
	malloc_mutex_lock(tsdn, &hooks_mu);
	hook_remove_locked((seq_hooks_t *)opaque);
	tsd_global_slow_dec(tsdn);
	malloc_mutex_unlock(tsdn, &hooks_mu);
}